

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O1

void __thiscall DBot::Serialize(DBot *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  botskill_t *def;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = Serialize<player_t>(arc,"player",&this->player,(player_t **)0x0);
  pFVar1 = ::Serialize(pFVar1,"angle",&(this->Angle).Degrees,(double *)0x0);
  ::Serialize(pFVar1,"dest",(DObject **)&this->dest,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"prev",(DObject **)&this->prev,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"enemy",(DObject **)&this->enemy,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"missile",(DObject **)&this->missile,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"mate",(DObject **)&this->mate,(DObject **)0x0,(bool *)0x0);
  def = (botskill_t *)0x0;
  ::Serialize(pFVar1,"lastmate",(DObject **)&this->last_mate,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"skill",&this->skill,def);
  pFVar1 = ::Serialize(pFVar1,"active",&this->t_active,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"respawn",&this->t_respawn,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"strafe",&this->t_strafe,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"react",&this->t_react,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"fight",&this->t_fight,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"roam",&this->t_roam,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"rocket",&this->t_rocket,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"firstshot",&this->first_shot,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"sleft",&this->sleft,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"allround",&this->allround,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"increase",&this->increase,(bool *)0x0);
  FSerializer::Array<double>(pFVar1,"old",&(this->old).X,(double *)0x0,2,true);
  return;
}

Assistant:

void DBot::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);

	arc("player", player)
		("angle", Angle)
		("dest", dest)
		("prev", prev)
		("enemy", enemy)
		("missile", missile)
		("mate", mate)
		("lastmate", last_mate)
		("skill", skill)
		("active", t_active)
		("respawn", t_respawn)
		("strafe", t_strafe)
		("react", t_react)
		("fight", t_fight)
		("roam", t_roam)
		("rocket", t_rocket)
		("firstshot", first_shot)
		("sleft", sleft)
		("allround", allround)
		("increase", increase)
		("old", old);
}